

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O0

void interpolate_extremum
               (int row,int col,response_layer *top,response_layer *middle,response_layer *bottom,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  response_layer *in_RCX;
  response_layer *in_RDX;
  int in_ESI;
  int in_EDI;
  int *in_R8;
  double dVar4;
  undefined1 auVar5 [64];
  undefined1 auVar7 [12];
  undefined1 auVar6 [16];
  interest_point ip;
  float ds;
  float dy;
  float dx;
  float offsets [3];
  int filter_step;
  float local_158;
  float local_154;
  float local_150;
  undefined1 uVar8;
  undefined6 in_stack_fffffffffffffeba;
  vector<interest_point,_std::allocator<interest_point>_> *in_stack_fffffffffffffec0;
  float *in_stack_ffffffffffffff40;
  response_layer *in_stack_ffffffffffffff48;
  response_layer *in_stack_ffffffffffffff50;
  response_layer *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  float local_38;
  float local_34;
  uint local_30;
  undefined1 extraout_var [56];
  
  iVar1 = in_RCX->filter_size;
  iVar2 = *in_R8;
  interpolate_step(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  dVar4 = std::fabs((double)(ulong)(uint)local_38);
  if (SUB84(dVar4,0) < 0.5) {
    dVar4 = std::fabs((double)(ulong)(uint)local_34);
    if (SUB84(dVar4,0) < 0.5) {
      auVar5._0_8_ = std::fabs((double)(ulong)local_30);
      auVar5._8_56_ = extraout_var;
      auVar7 = auVar5._4_12_;
      if (SUB84(auVar5._0_8_,0) < 0.5) {
        memset(&local_158,0,0x114);
        local_158 = ((float)in_ESI + local_38) * (float)in_RDX->step;
        local_154 = ((float)in_EDI + local_34) * (float)in_RDX->step;
        auVar6._0_4_ = (float)(iVar1 - iVar2);
        auVar6._4_12_ = auVar7;
        auVar6 = vfmadd213ss_fma(auVar6,ZEXT416(local_30),ZEXT416((uint)(float)in_RCX->filter_size))
        ;
        local_150 = auVar6._0_4_ * 0.1333;
        uVar8 = 1;
        bVar3 = get_laplacian_relative(in_RCX,in_EDI,in_ESI,in_RDX);
        std::vector<interest_point,_std::allocator<interest_point>_>::push_back
                  (in_stack_fffffffffffffec0,
                   (value_type *)CONCAT62(in_stack_fffffffffffffeba,CONCAT11(bVar3,uVar8)));
      }
    }
  }
  return;
}

Assistant:

void interpolate_extremum(int row, int col,
                          struct response_layer *top, struct response_layer *middle, struct response_layer *bottom,
                          std::vector<struct interest_point> *interest_points) {

    assert(top != NULL && middle != NULL && bottom != NULL);
    assert(interest_points != NULL);

    // getting step distance between filters
    int filter_step = (middle->filter_size - bottom->filter_size);

    // checking if middle filter is mid way between top and bottom
    assert(filter_step > 0 && top->filter_size - middle->filter_size == middle->filter_size - bottom->filter_size);

    // getting sub-pixel offset of extremum to actual location
    float offsets[3];
    interpolate_step(row, col, top, middle, bottom, offsets);

    // getting sub-pixel offsets and assigning them to variables for clarity
    float dx = offsets[0];
    float dy = offsets[1];
    float ds = offsets[2];

    // checking if sub-pixel offsets are less than 0.5 and
    // would thus rounded sub-pixel location is the same as pixel location
    if (fabs(dx) < 0.5f && fabs(dy) < 0.5f && fabs(ds) < 0.5f) {

        // initializing interest point
        struct interest_point ip = {
            .x = (float) ((col + dx) * top->step),
            .y = (float) ((row + dy) * top->step),
            .scale = (float) ((0.1333f) * (middle->filter_size + ds * filter_step)),
            .orientation = 0.0f,
            .upright = true,
            .laplacian = get_laplacian_relative(middle, row, col, top),
            .descriptor = {0}
        };

        // Add interest point to vector
        interest_points->push_back(ip);

    }

}